

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::CheckMemoryAccess
          (ValidationState_t *_,Instruction *inst,uint32_t index)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  StorageClass SVar4;
  StorageClass SVar5;
  int iVar6;
  uint uVar7;
  spv_result_t sVar8;
  Instruction *pIVar9;
  size_t index_00;
  char *pcVar10;
  string local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 - 0x3f < 2) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar9 = ValidationState_t::FindDef(_,uVar3);
    pIVar9 = ValidationState_t::FindDef(_,(pIVar9->inst_).type_id);
    SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIVar9,1);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar9 = ValidationState_t::FindDef(_,uVar3);
    pIVar9 = ValidationState_t::FindDef(_,(pIVar9->inst_).type_id);
    SVar5 = Instruction::GetOperandAs<spv::StorageClass>(pIVar9,1);
  }
  else {
    SVar5 = Max;
    if (uVar1 == 0x3d) {
LAB_0029a65c:
      index_00 = 2;
    }
    else {
      if (uVar1 != 0x3e) {
        if (uVar1 != 0x1169) {
          if ((uVar1 == 0x116a) || (uVar1 == 0x14f0)) goto LAB_0029a664;
          if (uVar1 != 0x14ef) {
            SVar4 = Max;
            goto LAB_0029a6fa;
          }
        }
        goto LAB_0029a65c;
      }
LAB_0029a664:
      index_00 = 0;
    }
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,index_00);
    pIVar9 = ValidationState_t::FindDef(_,uVar3);
    pIVar9 = ValidationState_t::FindDef(_,(pIVar9->inst_).type_id);
    SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIVar9,1);
  }
LAB_0029a6fa:
  if ((ulong)index <
      (ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)index);
    if ((uVar3 & 8) == 0) {
LAB_0029a72c:
      if ((uVar3 & 0x10) == 0) {
        if ((uVar3 & 0x20) != 0) {
LAB_0029a73c:
          if ((((StorageBuffer < SVar4) || ((0x1934U >> (SVar4 & 0x1f) & 1) == 0)) &&
              (SVar4 != PhysicalStorageBuffer)) ||
             ((((StorageBuffer < SVar5 || ((0x1934U >> (SVar5 & 0x1f) & 1) == 0)) &&
               (SVar5 != PhysicalStorageBuffer)) && (SVar5 != Max)))) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_208,
                            "NonPrivatePointerKHR requires a pointer in Uniform, ");
            std::operator<<((ostream *)&local_208,
                            "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer ");
            pcVar10 = "storage classes.";
            goto LAB_0029a97b;
          }
        }
        if ((uVar3 & 2) != 0) {
          return SPV_SUCCESS;
        }
        goto joined_r0x0029a79f;
      }
      uVar2 = (inst->inst_).opcode;
      if (((uVar2 == 0x3e) || (uVar2 == 0x14f0)) || (uVar2 == 0x116a)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "MakePointerVisibleKHR cannot be used with OpStore.";
      }
      else {
        if ((uVar3 & 0x20) != 0) {
          iVar6 = MemoryAccessNumWords(uVar3 & 0x1f);
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((index + iVar6) - 1));
          sVar8 = ValidateMemoryScope(_,inst,uVar7);
          if (sVar8 != SPV_SUCCESS) {
            return sVar8;
          }
          goto LAB_0029a73c;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"NonPrivatePointerKHR must be specified if ");
        pcVar10 = "MakePointerVisibleKHR is specified.";
      }
    }
    else {
      uVar2 = (inst->inst_).opcode;
      if (((uVar2 == 0x3d) || (uVar2 == 0x14ef)) || (uVar2 == 0x1169)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "MakePointerAvailableKHR cannot be used with OpLoad.";
      }
      else {
        if ((uVar3 & 0x20) != 0) {
          iVar6 = MemoryAccessNumWords(uVar3 & 0xf);
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((index + iVar6) - 1));
          sVar8 = ValidateMemoryScope(_,inst,uVar7);
          if (sVar8 != SPV_SUCCESS) {
            return sVar8;
          }
          goto LAB_0029a72c;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "NonPrivatePointerKHR must be specified if MakePointerAvailableKHR is specified.";
      }
    }
LAB_0029a97b:
    std::operator<<((ostream *)&local_208,pcVar10);
  }
  else {
joined_r0x0029a79f:
    if ((SVar4 != PhysicalStorageBuffer) && (SVar5 != PhysicalStorageBuffer)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x1264,(char *)0x0);
    std::operator<<((ostream *)&local_208,(string *)&local_228);
    std::operator<<((ostream *)&local_208,
                    "Memory accesses with PhysicalStorageBuffer must use Aligned.");
    std::__cxx11::string::_M_dispose();
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CheckMemoryAccess(ValidationState_t& _, const Instruction* inst,
                               uint32_t index) {
  spv::StorageClass dst_sc, src_sc;
  std::tie(dst_sc, src_sc) = GetStorageClass(_, inst);
  if (inst->operands().size() <= index) {
    // Cases where lack of some operand is invalid
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
    return SPV_SUCCESS;
  }

  const uint32_t mask = inst->GetOperandAs<uint32_t>(index);
  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
    if (inst->opcode() == spv::Op::OpLoad ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerAvailableKHR cannot be used with OpLoad.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
                "MakePointerAvailableKHR is specified.";
    }

    // Check the associated scope for MakeAvailableKHR.
    const auto available_scope = GetMakeAvailableScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
    if (inst->opcode() == spv::Op::OpStore ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerVisibleKHR cannot be used with OpStore.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
             << "MakePointerVisibleKHR is specified.";
    }

    // Check the associated scope for MakeVisibleKHR.
    const auto visible_scope = GetMakeVisibleScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR)) {
    if (dst_sc != spv::StorageClass::Uniform &&
        dst_sc != spv::StorageClass::Workgroup &&
        dst_sc != spv::StorageClass::CrossWorkgroup &&
        dst_sc != spv::StorageClass::Generic &&
        dst_sc != spv::StorageClass::Image &&
        dst_sc != spv::StorageClass::StorageBuffer &&
        dst_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
    if (src_sc != spv::StorageClass::Max &&
        src_sc != spv::StorageClass::Uniform &&
        src_sc != spv::StorageClass::Workgroup &&
        src_sc != spv::StorageClass::CrossWorkgroup &&
        src_sc != spv::StorageClass::Generic &&
        src_sc != spv::StorageClass::Image &&
        src_sc != spv::StorageClass::StorageBuffer &&
        src_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
  }

  if (!(mask & uint32_t(spv::MemoryAccessMask::Aligned))) {
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
  }

  return SPV_SUCCESS;
}